

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkDarFraig(Abc_Ntk_t *pNtk,int nConfLimit,int fDoSparse,int fProve,int fTransfer,int fSpeculate
               ,int fChoicing,int fVerbose)

{
  Aig_Man_t *pManAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  Fra_Par_t local_a8;
  
  pAVar1 = (Abc_Ntk_t *)0x0;
  pManAig = Abc_NtkToDar(pNtk,0,0);
  if (pManAig != (Aig_Man_t *)0x0) {
    Fra_ParamsDefault(&local_a8);
    local_a8.fChoicing = fChoicing;
    local_a8.fVerbose = fVerbose;
    local_a8.fSpeculate = fSpeculate;
    local_a8.fProve = fProve;
    local_a8.fDoSparse = fDoSparse;
    local_a8.nBTLimitNode = nConfLimit;
    pMan = Fra_FraigPerform(pManAig,&local_a8);
    if (fChoicing == 0) {
      pAVar1 = Abc_NtkFromDar(pNtk,pMan);
    }
    else {
      pAVar1 = Abc_NtkFromDarChoices(pNtk,pMan);
    }
    Aig_ManStop(pManAig);
    Aig_ManStop(pMan);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarFraig( Abc_Ntk_t * pNtk, int nConfLimit, int fDoSparse, int fProve, int fTransfer, int fSpeculate, int fChoicing, int fVerbose )
{
    Fra_Par_t Pars, * pPars = &Pars; 
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    Fra_ParamsDefault( pPars );
    pPars->nBTLimitNode = nConfLimit;
    pPars->fChoicing    = fChoicing;
    pPars->fDoSparse    = fDoSparse;
    pPars->fSpeculate   = fSpeculate;
    pPars->fProve       = fProve;
    pPars->fVerbose     = fVerbose;
    pMan = Fra_FraigPerform( pTemp = pMan, pPars );
    if ( fChoicing )
        pNtkAig = Abc_NtkFromDarChoices( pNtk, pMan );
    else
        pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pTemp );
    Aig_ManStop( pMan );
    return pNtkAig;
}